

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaSAXHandleStartElementNs
               (void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI,int nb_namespaces,
               xmlChar **namespaces,int nb_attributes,int nb_defaulted,xmlChar **attributes)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  xmlChar *pxVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  xmlChar xVar9;
  int iVar10;
  undefined4 in_register_00000084;
  xmlChar *pxVar11;
  int iVar12;
  xmlChar **ppxVar13;
  long lVar14;
  xmlChar *in_stack_ffffffffffffffb8;
  
  pxVar11 = (xmlChar *)CONCAT44(in_register_00000084,nb_namespaces);
  iVar2 = *(int *)((long)ctx + 0xac) + 1;
  *(int *)((long)ctx + 0xac) = iVar2;
  if (*(int *)((long)ctx + 0x130) <= iVar2 && *(int *)((long)ctx + 0x130) != -1) {
    return;
  }
  iVar2 = xmlSchemaValidatorPushElem((xmlSchemaValidCtxtPtr)ctx);
  if (iVar2 == -1) {
    pcVar6 = "calling xmlSchemaValidatorPushElem()";
  }
  else {
    lVar1 = *(long *)((long)ctx + 0xc0);
    iVar2 = xmlSAX2GetLineNumber(*(void **)((long)ctx + 0x50));
    *(int *)(lVar1 + 0x10) = iVar2;
    *(xmlChar **)(lVar1 + 0x18) = localname;
    *(xmlChar **)(lVar1 + 0x20) = URI;
    *(byte *)(lVar1 + 0x40) = *(byte *)(lVar1 + 0x40) | 0x20;
    if (0 < nb_namespaces) {
      ppxVar13 = namespaces + 1;
      do {
        pvVar3 = *(void **)(lVar1 + 0x78);
        if (pvVar3 == (void *)0x0) {
          pvVar3 = (*xmlMalloc)(0x50);
          *(void **)(lVar1 + 0x78) = pvVar3;
          if (pvVar3 == (void *)0x0) {
            if ((xmlSchemaValidCtxtPtr)ctx != (xmlSchemaValidCtxtPtr)0x0) {
              ((xmlSchemaValidCtxtPtr)ctx)->nberrors = ((xmlSchemaValidCtxtPtr)ctx)->nberrors + 1;
              ((xmlSchemaValidCtxtPtr)ctx)->err = 0x71a;
            }
            pcVar6 = "allocating namespace bindings for SAX validation";
            goto LAB_001af72f;
          }
          *(undefined8 *)(lVar1 + 0x80) = 0x500000000;
          iVar2 = 0;
        }
        else {
          iVar12 = *(int *)(lVar1 + 0x84);
          iVar2 = *(int *)(lVar1 + 0x80);
          if (iVar12 <= iVar2) {
            *(int *)(lVar1 + 0x84) = iVar12 * 2;
            pvVar3 = (*xmlRealloc)(pvVar3,(long)iVar12 << 5);
            *(void **)(lVar1 + 0x78) = pvVar3;
            if (pvVar3 == (void *)0x0) {
              if ((xmlSchemaValidCtxtPtr)ctx != (xmlSchemaValidCtxtPtr)0x0) {
                ((xmlSchemaValidCtxtPtr)ctx)->nberrors = ((xmlSchemaValidCtxtPtr)ctx)->nberrors + 1;
                ((xmlSchemaValidCtxtPtr)ctx)->err = 0x71a;
              }
              pcVar6 = "re-allocating namespace bindings for SAX validation";
              goto LAB_001af72f;
            }
            iVar2 = *(int *)(lVar1 + 0x80);
          }
        }
        *(xmlChar **)((long)pvVar3 + (long)(iVar2 * 2) * 8) = ppxVar13[-1];
        pxVar4 = *ppxVar13;
        if (**ppxVar13 == '\0') {
          pxVar4 = (xmlChar *)0x0;
        }
        *(xmlChar **)(*(long *)(lVar1 + 0x78) + (long)(iVar2 * 2 + 1) * 8) = pxVar4;
        *(int *)(lVar1 + 0x80) = iVar2 + 1;
        ppxVar13 = ppxVar13 + 2;
        nb_namespaces = nb_namespaces + -1;
      } while (nb_namespaces != 0);
    }
    if (0 < nb_attributes) {
      lVar14 = 0;
      iVar2 = 0;
      do {
        iVar12 = *(int *)(attributes + lVar14 + 4) - *(int *)(attributes + lVar14 + 3);
        pvVar3 = (*xmlMallocAtomic)((long)(iVar12 + 1));
        if (pvVar3 == (void *)0x0) {
          if ((xmlSchemaValidCtxtPtr)ctx != (xmlSchemaValidCtxtPtr)0x0) {
            ((xmlSchemaValidCtxtPtr)ctx)->nberrors = ((xmlSchemaValidCtxtPtr)ctx)->nberrors + 1;
            ((xmlSchemaValidCtxtPtr)ctx)->err = 0x71a;
          }
          pcVar6 = "allocating string for decoded attribute";
LAB_001af72f:
          __xmlSimpleError(0x11,2,(xmlNodePtr)0x0,(char *)0x0,pcVar6);
          goto LAB_001af742;
        }
        if (iVar12 < 1) {
          uVar5 = 0;
        }
        else {
          uVar5 = 0;
          uVar8 = 0;
          do {
            pxVar11 = attributes[lVar14 + 3];
            iVar10 = 1;
            xVar9 = pxVar11[uVar8];
            if (((((int)uVar8 < iVar12 + -4) && (xVar9 == '&')) &&
                (xVar9 = '&', pxVar11[uVar8 + 1] == '#')) &&
               ((pxVar11[uVar8 + 2] == '3' && (pxVar11[uVar8 + 3] == '8')))) {
              iVar10 = (uint)(pxVar11[uVar8 + 4] == ';') * 4 + 1;
            }
            *(xmlChar *)((long)pvVar3 + uVar5) = xVar9;
            uVar7 = (int)uVar8 + iVar10;
            uVar8 = (ulong)uVar7;
            uVar5 = uVar5 + 1;
          } while ((int)uVar7 < iVar12);
          uVar5 = uVar5 & 0xffffffff;
        }
        *(undefined1 *)((long)pvVar3 + uVar5) = 0;
        pxVar11 = attributes[lVar14 + 2];
        iVar12 = xmlSchemaValidatorPushAttribute
                           ((xmlSchemaValidCtxtPtr)ctx,(xmlNodePtr)0x0,*(int *)(lVar1 + 0x10),
                            attributes[lVar14],pxVar11,(int)pvVar3,in_stack_ffffffffffffffb8,
                            (int)ctx);
        if (iVar12 == -1) {
          pcVar6 = "calling xmlSchemaValidatorPushAttribute()";
          goto LAB_001af6eb;
        }
        iVar2 = iVar2 + 1;
        lVar14 = lVar14 + 5;
      } while (iVar2 != nb_attributes);
    }
    iVar2 = xmlSchemaValidateElem((xmlSchemaValidCtxtPtr)ctx);
    if (iVar2 != -1) {
      return;
    }
    pcVar6 = "calling xmlSchemaValidateElem()";
  }
LAB_001af6eb:
  xmlSchemaInternalErr2
            ((xmlSchemaAbstractCtxtPtr)ctx,"xmlSchemaSAXHandleStartElementNs",pcVar6,(xmlChar *)0x0,
             pxVar11);
LAB_001af742:
  ((xmlSchemaValidCtxtPtr)ctx)->err = -1;
  xmlStopParser(((xmlSchemaValidCtxtPtr)ctx)->parserCtxt);
  return;
}

Assistant:

static void
xmlSchemaSAXHandleStartElementNs(void *ctx,
				 const xmlChar * localname,
				 const xmlChar * prefix ATTRIBUTE_UNUSED,
				 const xmlChar * URI,
				 int nb_namespaces,
				 const xmlChar ** namespaces,
				 int nb_attributes,
				 int nb_defaulted ATTRIBUTE_UNUSED,
				 const xmlChar ** attributes)
{
    xmlSchemaValidCtxtPtr vctxt = (xmlSchemaValidCtxtPtr) ctx;
    int ret;
    xmlSchemaNodeInfoPtr ielem;
    int i, j;

    /*
    * SAX VAL TODO: What to do with nb_defaulted?
    */
    /*
    * Skip elements if inside a "skip" wildcard or invalid.
    */
    vctxt->depth++;
    if ((vctxt->skipDepth != -1) && (vctxt->depth >= vctxt->skipDepth))
	return;
    /*
    * Push the element.
    */
    if (xmlSchemaValidatorPushElem(vctxt) == -1) {
	VERROR_INT("xmlSchemaSAXHandleStartElementNs",
	    "calling xmlSchemaValidatorPushElem()");
	goto internal_error;
    }
    ielem = vctxt->inode;
    /*
    * TODO: Is this OK?
    */
    ielem->nodeLine = xmlSAX2GetLineNumber(vctxt->parserCtxt);
    ielem->localName = localname;
    ielem->nsName = URI;
    ielem->flags |= XML_SCHEMA_ELEM_INFO_EMPTY;
    /*
    * Register namespaces on the elem info.
    */
    if (nb_namespaces != 0) {
	/*
	* Although the parser builds its own namespace list,
	* we have no access to it, so we'll use an own one.
	*/
        for (i = 0, j = 0; i < nb_namespaces; i++, j += 2) {
	    /*
	    * Store prefix and namespace name.
	    */
	    if (ielem->nsBindings == NULL) {
		ielem->nsBindings =
		    (const xmlChar **) xmlMalloc(10 *
			sizeof(const xmlChar *));
		if (ielem->nsBindings == NULL) {
		    xmlSchemaVErrMemory(vctxt,
			"allocating namespace bindings for SAX validation",
			NULL);
		    goto internal_error;
		}
		ielem->nbNsBindings = 0;
		ielem->sizeNsBindings = 5;
	    } else if (ielem->sizeNsBindings <= ielem->nbNsBindings) {
		ielem->sizeNsBindings *= 2;
		ielem->nsBindings =
		    (const xmlChar **) xmlRealloc(
			(void *) ielem->nsBindings,
			ielem->sizeNsBindings * 2 * sizeof(const xmlChar *));
		if (ielem->nsBindings == NULL) {
		    xmlSchemaVErrMemory(vctxt,
			"re-allocating namespace bindings for SAX validation",
			NULL);
		    goto internal_error;
		}
	    }

	    ielem->nsBindings[ielem->nbNsBindings * 2] = namespaces[j];
	    if (namespaces[j+1][0] == 0) {
		/*
		* Handle xmlns="".
		*/
		ielem->nsBindings[ielem->nbNsBindings * 2 + 1] = NULL;
	    } else
		ielem->nsBindings[ielem->nbNsBindings * 2 + 1] =
		    namespaces[j+1];
	    ielem->nbNsBindings++;
	}
    }
    /*
    * Register attributes.
    * SAX VAL TODO: We are not adding namespace declaration
    * attributes yet.
    */
    if (nb_attributes != 0) {
	int valueLen, k, l;
	xmlChar *value;

        for (j = 0, i = 0; i < nb_attributes; i++, j += 5) {
	    /*
	    * Duplicate the value, changing any &#38; to a literal ampersand.
	    *
	    * libxml2 differs from normal SAX here in that it escapes all ampersands
	    * as &#38; instead of delivering the raw converted string. Changing the
	    * behavior at this point would break applications that use this API, so
	    * we are forced to work around it.
	    */
	    valueLen = attributes[j+4] - attributes[j+3];
	    value = xmlMallocAtomic(valueLen + 1);
	    if (value == NULL) {
		xmlSchemaVErrMemory(vctxt,
		    "allocating string for decoded attribute",
		    NULL);
		goto internal_error;
	    }
	    for (k = 0, l = 0; k < valueLen; l++) {
		if (k < valueLen - 4 &&
		    attributes[j+3][k+0] == '&' &&
		    attributes[j+3][k+1] == '#' &&
		    attributes[j+3][k+2] == '3' &&
		    attributes[j+3][k+3] == '8' &&
		    attributes[j+3][k+4] == ';') {
		    value[l] = '&';
		    k += 5;
		} else {
		    value[l] = attributes[j+3][k];
		    k++;
		}
	    }
	    value[l] = '\0';
	    /*
	    * TODO: Set the node line.
	    */
	    ret = xmlSchemaValidatorPushAttribute(vctxt,
		NULL, ielem->nodeLine, attributes[j], attributes[j+2], 0,
		value, 1);
	    if (ret == -1) {
		VERROR_INT("xmlSchemaSAXHandleStartElementNs",
		    "calling xmlSchemaValidatorPushAttribute()");
		goto internal_error;
	    }
	}
    }
    /*
    * Validate the element.
    */
    ret = xmlSchemaValidateElem(vctxt);
    if (ret != 0) {
	if (ret == -1) {
	    VERROR_INT("xmlSchemaSAXHandleStartElementNs",
		"calling xmlSchemaValidateElem()");
	    goto internal_error;
	}
	goto exit;
    }

exit:
    return;
internal_error:
    vctxt->err = -1;
    xmlStopParser(vctxt->parserCtxt);
    return;
}